

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::TagAlias::~TagAlias(TagAlias *this)

{
  string *in_RDI;
  
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x186c8c);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

TagAlias( std::string _tag, SourceLineInfo _lineInfo ) : tag( _tag ), lineInfo( _lineInfo ) {}